

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

int test_socket_impl(char *file,int line,int family,int protocol)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  int sock;
  int protocol_local;
  int family_local;
  int line_local;
  char *file_local;
  
  iVar1 = nn_socket(family,protocol);
  __stream = _stderr;
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(__stream,"Failed create socket: %s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,file,
            (ulong)(uint)line);
    nn_err_abort();
  }
  return iVar1;
}

Assistant:

static int NN_UNUSED test_socket_impl (char *file, int line, int family,
    int protocol)
{
    int sock;

    sock = nn_socket (family, protocol);
    if (sock == -1) {
        fprintf (stderr, "Failed create socket: %s [%d] (%s:%d)\n",
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }

    return sock;
}